

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMAttrMapImpl.cpp
# Opt level: O2

DOMNode * __thiscall
xercesc_4_0::DOMAttrMapImpl::removeNamedItemNS
          (DOMAttrMapImpl *this,XMLCh *namespaceURI,XMLCh *localName)

{
  DOMNodeVector *this_00;
  bool bVar1;
  uint uVar2;
  int iVar3;
  undefined4 extraout_var;
  DOMNodeImpl *pDVar4;
  undefined4 extraout_var_00;
  long *plVar5;
  undefined8 uVar6;
  DOMException *this_01;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  ulong index;
  DOMNode *p;
  DOMNode *pDVar7;
  undefined8 *puVar8;
  
  bVar1 = readOnly(this);
  if (bVar1) {
    this_01 = (DOMException *)__cxa_allocate_exception(0x28);
    puVar8 = &XMLPlatformUtils::fgMemoryManager;
    if (this->fOwnerNode != (DOMNode *)0x0) {
      iVar3 = (*this->fOwnerNode->_vptr_DOMNode[0xc])();
      if (CONCAT44(extraout_var_01,iVar3) != 0) {
        iVar3 = (*this->fOwnerNode->_vptr_DOMNode[0xc])();
        puVar8 = (undefined8 *)(CONCAT44(extraout_var_02,iVar3) + 0x158);
      }
    }
    DOMException::DOMException(this_01,7,0,(MemoryManager *)*puVar8);
  }
  else {
    uVar2 = (*(this->super_DOMNamedNodeMap)._vptr_DOMNamedNodeMap[0xf])(this,namespaceURI,localName)
    ;
    if (-1 < (int)uVar2) {
      this_00 = this->fNodes;
      index = (ulong)uVar2;
      if (index < this_00->nextFreeSlot) {
        p = this_00->data[index];
      }
      else {
        p = (DOMNode *)0x0;
      }
      DOMNodeVector::removeElementAt(this_00,index);
      iVar3 = (*this->fOwnerNode->_vptr_DOMNode[0xc])();
      pDVar7 = (DOMNode *)(CONCAT44(extraout_var,iVar3) + 0x18);
      if (CONCAT44(extraout_var,iVar3) == 0) {
        pDVar7 = (DOMNode *)0x0;
      }
      pDVar4 = castToNodeImpl(p);
      pDVar4->fOwnerNode = pDVar7;
      pDVar4 = castToNodeImpl(p);
      pDVar4->flags = pDVar4->flags & 0xfff7;
      iVar3 = (*(this->super_DOMNamedNodeMap)._vptr_DOMNamedNodeMap[0xc])(this);
      if ((p != (DOMNode *)0x0) && ((char)iVar3 != '\0')) {
        iVar3 = (*this->fOwnerNode->_vptr_DOMNode[0x4a])();
        plVar5 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_00,iVar3) + 0x38))
                                   ((long *)CONCAT44(extraout_var_00,iVar3),namespaceURI,localName);
        if (plVar5 != (long *)0x0) {
          uVar6 = (**(code **)(*plVar5 + 0x68))(plVar5,1);
          (*(this->super_DOMNamedNodeMap)._vptr_DOMNamedNodeMap[8])(this,uVar6);
        }
      }
      return p;
    }
    this_01 = (DOMException *)__cxa_allocate_exception(0x28);
    puVar8 = &XMLPlatformUtils::fgMemoryManager;
    if (this->fOwnerNode != (DOMNode *)0x0) {
      iVar3 = (*this->fOwnerNode->_vptr_DOMNode[0xc])();
      if (CONCAT44(extraout_var_03,iVar3) != 0) {
        iVar3 = (*this->fOwnerNode->_vptr_DOMNode[0xc])();
        puVar8 = (undefined8 *)(CONCAT44(extraout_var_04,iVar3) + 0x158);
      }
    }
    DOMException::DOMException(this_01,8,0,(MemoryManager *)*puVar8);
  }
  __cxa_throw(this_01,&DOMException::typeinfo,DOMException::~DOMException);
}

Assistant:

DOMNode *DOMAttrMapImpl::removeNamedItemNS(const XMLCh *namespaceURI, const XMLCh *localName)
{
    if (this->readOnly())
        throw DOMException(
        DOMException::NO_MODIFICATION_ALLOWED_ERR, 0, GetDOMNamedNodeMapMemoryManager);
    int i = findNamePoint(namespaceURI, localName);
    if (i < 0)
        throw DOMException(DOMException::NOT_FOUND_ERR, 0, GetDOMNamedNodeMapMemoryManager);

    DOMNode * removed = fNodes -> elementAt(i);
    fNodes -> removeElementAt(i);	//remove n from nodes
    castToNodeImpl(removed)->fOwnerNode = fOwnerNode->getOwnerDocument();
    castToNodeImpl(removed)->isOwned(false);

    // Replace it if it had a default value
    // (DOM spec level 2 - Element Interface)

    if (hasDefaults() && (removed != 0))
    {
        DOMAttrMapImpl* defAttrs = ((DOMElementImpl*)fOwnerNode)->getDefaultAttributes();
        DOMAttr* attr = (DOMAttr*)(defAttrs->getNamedItemNS(namespaceURI, localName));
        if (attr != 0)
        {
            DOMAttr* newAttr = (DOMAttr*)attr->cloneNode(true);
            setNamedItemNS(newAttr);
        }
    }

    return removed;
}